

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interact.cc
# Opt level: O0

bool contains_valid_namespaces(vw *all,features *f_src1,features *f_src2,interact *in)

{
  size_t sVar1;
  float *pfVar2;
  ostream *poVar3;
  char *in_RCX;
  v_array<float> *in_RDX;
  v_array<float> *in_RSI;
  long in_RDI;
  
  sVar1 = features::size((features *)0x2e6ea1);
  if ((sVar1 == 0) || (sVar1 = features::size((features *)0x2e6eb1), sVar1 == 0)) {
    return false;
  }
  pfVar2 = v_array<float>::operator[](in_RSI,0);
  if ((*pfVar2 == 1.0) && (!NAN(*pfVar2))) {
    pfVar2 = v_array<float>::operator[](in_RDX,0);
    if ((*pfVar2 == 1.0) && (!NAN(*pfVar2))) {
      return true;
    }
    poVar3 = std::operator<<((ostream *)(in_RDI + 0xe0),"Namespace \'");
    poVar3 = std::operator<<(poVar3,in_RCX[1]);
    std::operator<<(poVar3,"\' misses anchor feature with value 1");
    return false;
  }
  poVar3 = std::operator<<((ostream *)(in_RDI + 0xe0),"Namespace \'");
  poVar3 = std::operator<<(poVar3,*in_RCX);
  std::operator<<(poVar3,"\' misses anchor feature with value 1");
  return false;
}

Assistant:

bool contains_valid_namespaces(vw& all, features& f_src1, features& f_src2, interact& in)
{
  // first feature must be 1 so we're sure that the anchor feature is present
  if (f_src1.size() == 0 || f_src2.size() == 0)
    return false;

  if (f_src1.values[0] != 1)
  {
    all.trace_message << "Namespace '" << (char)in.n1 << "' misses anchor feature with value 1";
    return false;
  }

  if (f_src2.values[0] != 1)
  {
    all.trace_message << "Namespace '" << (char)in.n2 << "' misses anchor feature with value 1";
    return false;
  }

  return true;
}